

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall QOpenGLFunctions::glBindTexture(QOpenGLFunctions *this,GLenum target,GLuint texture)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  
  (**(code **)*in_RDI)(in_ESI,in_EDX);
  return;
}

Assistant:

inline void QOpenGLFunctions::glBindTexture(GLenum target, GLuint texture)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glBindTexture(target, texture);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.BindTexture(target, texture);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}